

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::IfcTendon(IfcTendon *this)

{
  IfcTendon *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x220,"IfcTendon");
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__00f8fab0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,&PTR_construction_vtable_24__00f8fc90)
  ;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0xf8f930;
  *(undefined8 *)&this->field_0x220 = 0xf8fa98;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0xf8f958;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf8f980;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0xf8f9a8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0xf8f9d0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0xf8f9f8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0xf8fa20;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0xf8fa48;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0xf8fa70;
  std::__cxx11::string::string((string *)&(this->super_IfcReinforcingElement).field_0x1a0);
  STEP::Maybe<double>::Maybe(&this->TensionForce);
  STEP::Maybe<double>::Maybe(&this->PreStress);
  STEP::Maybe<double>::Maybe(&this->FrictionCoefficient);
  STEP::Maybe<double>::Maybe(&this->AnchorageSlip);
  STEP::Maybe<double>::Maybe(&this->MinCurvatureRadius);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}